

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O0

bool __thiscall
xray_re::xr_ini_file::ini_section::line_exist(ini_section *this,char *lname,char **lvalue)

{
  bool bVar1;
  int iVar2;
  char *s1;
  ini_item *piVar3;
  bool bVar4;
  __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  local_50;
  ini_item_pred local_48;
  __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  local_40;
  __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  local_38;
  __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  local_30;
  ini_item_vec_cit it;
  char **lvalue_local;
  char *lname_local;
  ini_section *this_local;
  
  it._M_current = (ini_item **)lvalue;
  local_38._M_current = (ini_item **)begin(this);
  local_40._M_current = (ini_item **)end(this);
  ini_item_pred::ini_item_pred(&local_48,lname);
  local_30 = lower_bound_if<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_item*const*,std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>>,xray_re::xr_ini_file::ini_item_pred>
                       (local_38,local_40,local_48);
  local_50._M_current = (ini_item **)end(this);
  bVar1 = __gnu_cxx::operator==(&local_30,&local_50);
  bVar4 = true;
  if (!bVar1) {
    __gnu_cxx::
    __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
    ::operator*(&local_30);
    s1 = (char *)std::__cxx11::string::c_str();
    iVar2 = xr_stricmp(s1,lname);
    bVar4 = iVar2 != 0;
  }
  if (bVar4) {
    this_local._7_1_ = false;
  }
  else {
    if (it._M_current != (ini_item **)0x0) {
      __gnu_cxx::
      __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
      ::operator*(&local_30);
      piVar3 = (ini_item *)std::__cxx11::string::c_str();
      *it._M_current = piVar3;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool xr_ini_file::ini_section::line_exist(const char* lname, const char** lvalue) const
{
	ini_item_vec_cit it = lower_bound_if(begin(), end(), ini_item_pred(lname));
	if (it == end() || xr_stricmp((*it)->name.c_str(), lname) != 0)
		return false;
	if (lvalue)
		*lvalue = (*it)->value.c_str();
	return true;
}